

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QDnsServiceRecord __thiscall
QList<QDnsServiceRecord>::takeAt(QList<QDnsServiceRecord> *this,qsizetype i)

{
  char *in_RDX;
  QList<QDnsServiceRecord> *in_RSI;
  QSharedDataPointer<QDnsServiceRecordPrivate> in_RDI;
  QDnsServiceRecord *t;
  QDnsServiceRecordPrivate *this_00;
  
  *(undefined8 *)&((QDnsServiceRecordPrivate *)in_RDI.d.ptr)->super_QDnsRecordPrivate =
       0xaaaaaaaaaaaaaaaa;
  this_00 = (QDnsServiceRecordPrivate *)in_RDI.d.ptr;
  operator[]((QList<QDnsServiceRecord> *)in_RDI.d.ptr,(qsizetype)in_RDI.d.ptr);
  QDnsServiceRecord::QDnsServiceRecord
            ((QDnsServiceRecord *)this_00,(QDnsServiceRecord *)in_RDI.d.ptr);
  remove(in_RSI,in_RDX);
  return (QSharedDataPointer<QDnsServiceRecordPrivate>)
         (QSharedDataPointer<QDnsServiceRecordPrivate>)in_RDI.d.ptr;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }